

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QColorListView.cpp
# Opt level: O0

void __thiscall QColorListView::setSelectedColors(QColorListView *this,QList<QColor> *colorsList)

{
  bool bVar1;
  int iVar2;
  long *plVar3;
  long in_RDI;
  QString colorName;
  QModelIndex index;
  int i;
  QColor *color;
  QForeachContainer<QList<QColor>_> _container_113;
  QItemSelection selection;
  QSet<QString> colors;
  QString *in_stack_fffffffffffffe78;
  undefined7 in_stack_fffffffffffffe80;
  undefined1 in_stack_fffffffffffffe87;
  QColorListViewPrivate *in_stack_fffffffffffffe88;
  undefined4 in_stack_fffffffffffffe90;
  undefined4 in_stack_fffffffffffffe94;
  int iVar4;
  QModelIndex *this_00;
  QFlags<QItemSelectionModel::SelectionFlag> local_124;
  QVariant local_120;
  QModelIndex local_e8;
  undefined1 local_d0 [24];
  QModelIndex local_b8;
  int local_9c;
  QColor *local_80;
  QColor *local_78;
  const_iterator local_48;
  const_iterator local_40;
  undefined1 local_30 [48];
  
  QSet<QString>::QSet((QSet<QString> *)0x218711);
  QItemSelection::QItemSelection((QItemSelection *)0x21871e);
  QtPrivate::qMakeForeachContainer<QList<QColor>const&>((QList<QColor> *)in_stack_fffffffffffffe88);
  while( true ) {
    local_78 = local_40.i;
    bVar1 = QList<QColor>::const_iterator::operator!=(&local_48,local_40);
    if (!bVar1) break;
    local_80 = QList<QColor>::const_iterator::operator*(&local_48);
    QColorListViewPrivate::internalColorName
              (in_stack_fffffffffffffe88,
               (QColor *)CONCAT17(in_stack_fffffffffffffe87,in_stack_fffffffffffffe80));
    QSet<QString>::operator<<
              ((QSet<QString> *)CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),
               (QString *)in_stack_fffffffffffffe88);
    QString::~QString((QString *)0x218815);
    QList<QColor>::const_iterator::operator++(&local_48);
  }
  QtPrivate::QForeachContainer<QList<QColor>_>::~QForeachContainer
            ((QForeachContainer<QList<QColor>_> *)0x218779);
  local_9c = 0;
  while( true ) {
    iVar4 = local_9c;
    plVar3 = *(long **)(*(long *)(in_RDI + 0x28) + 0x18);
    QModelIndex::QModelIndex(&local_b8);
    iVar2 = (**(code **)(*plVar3 + 0x78))(plVar3,&local_b8);
    if (iVar2 <= iVar4) break;
    plVar3 = *(long **)(*(long *)(in_RDI + 0x28) + 0x18);
    this_00 = &local_e8;
    iVar4 = local_9c;
    QModelIndex::QModelIndex(this_00);
    (**(code **)(*plVar3 + 0x60))(local_d0,plVar3,iVar4,0,this_00);
    QModelIndex::data(this_00,iVar4);
    QVariant::toString();
    QVariant::~QVariant(&local_120);
    in_stack_fffffffffffffe87 =
         QSet<QString>::contains
                   ((QSet<QString> *)CONCAT17(in_stack_fffffffffffffe87,in_stack_fffffffffffffe80),
                    in_stack_fffffffffffffe78);
    if ((bool)in_stack_fffffffffffffe87) {
      QItemSelection::select((QModelIndex *)local_30,(QModelIndex *)local_d0);
    }
    QString::~QString((QString *)0x2189dc);
    local_9c = local_9c + 1;
  }
  plVar3 = (long *)QAbstractItemView::selectionModel();
  QFlags<QItemSelectionModel::SelectionFlag>::QFlags(&local_124,ClearAndSelect);
  (**(code **)(*plVar3 + 0x70))(plVar3,local_30,local_124.i);
  QItemSelection::~QItemSelection((QItemSelection *)0x218a39);
  QSet<QString>::~QSet((QSet<QString> *)0x218a46);
  return;
}

Assistant:

void QColorListView::setSelectedColors(const QList<QColor> &colorsList) {
    QSet<QString> colors;
    QItemSelection selection;

    foreach (const QColor &color, colorsList) {
        colors << d->internalColorName(color);
    }

    for (int i = 0; i < d->model->rowCount(); i++) {
        const QModelIndex index = d->model->index(i, 0);
        const QString colorName = index.data(static_cast<int>(QColorListModel::Role::HexArgbName)).toString();

        if (colors.contains(colorName)) {
            selection.select(index, index);
        }
    }

    selectionModel()->select(selection, QItemSelectionModel::ClearAndSelect);
}